

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cascade.cpp
# Opt level: O2

complex_t __thiscall Iir::Cascade::response(Cascade *this,double normalizedFrequency)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  complex<double> cVar8;
  double local_98;
  undefined8 uStack_90;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  complex<double> local_58;
  complex<double> local_48;
  
  if (0.5 < normalizedFrequency) {
    throw_invalid_argument("The normalised frequency needs to be =< 0.5.");
  }
  if (normalizedFrequency < 0.0) {
    throw_invalid_argument("The normalised frequency needs to be >= 0.");
  }
  dVar6 = -(normalizedFrequency * 6.283185307179586);
  local_98 = cos(dVar6);
  dVar6 = sin(dVar6);
  dVar1 = normalizedFrequency * 6.283185307179586 * -2.0;
  dVar2 = cos(dVar1);
  dVar1 = sin(dVar1);
  local_48._M_value._0_8_ = 0x3ff0000000000000;
  local_48._M_value._8_8_ = 0;
  local_58._M_value._0_8_ = 0x3ff0000000000000;
  local_58._M_value._8_8_ = 0;
  iVar3 = this->m_numStages;
  uStack_90._0_4_ = SUB84(dVar6,0);
  uStack_90._4_4_ = (int)((ulong)dVar6 >> 0x20);
  pdVar4 = &this->m_stageArray->m_b0;
  for (; 0 < iVar3; iVar3 = iVar3 + -1) {
    dVar6 = ((Biquad *)(pdVar4 + -5))->m_a0;
    dVar5 = (pdVar4[-2] * dVar6) / dVar6;
    dVar7 = (pdVar4[-1] * dVar6) / dVar6;
    local_78 = dVar7 * dVar2 + dVar5 * local_98 + (*pdVar4 * dVar6) / dVar6;
    dStack_70 = dVar7 * dVar1 + dVar5 * uStack_90 + 0.0;
    dVar5 = (pdVar4[-4] * dVar6) / dVar6;
    dVar6 = (pdVar4[-3] * dVar6) / dVar6;
    local_68 = dVar6 * dVar2 + dVar5 * local_98 + 1.0;
    dStack_60 = dVar6 * dVar1 + dVar5 * uStack_90 + 0.0;
    std::complex<double>::operator*=(&local_48,(complex<double> *)&local_78);
    std::complex<double>::operator*=(&local_58,(complex<double> *)&local_68);
    pdVar4 = pdVar4 + 6;
  }
  cVar8 = std::operator/(&local_48,&local_58);
  return (complex_t)cVar8._M_value;
}

Assistant:

complex_t Cascade::response (double normalizedFrequency) const
	{
		if (normalizedFrequency > 0.5) throw_invalid_argument(maxFError);
		if (normalizedFrequency < 0.0) throw_invalid_argument(minFError);
		double w = 2 * doublePi * normalizedFrequency;
		const complex_t czn1 = std::polar (1., -w);
		const complex_t czn2 = std::polar (1., -2 * w);
		complex_t ch (1);
		complex_t cbot (1);

		const Biquad* stage = m_stageArray;
		for (int i = m_numStages; --i >=0; ++stage)
		{
			complex_t cb (1);
			complex_t ct    (stage->getB0()/stage->getA0());
			ct = addmul (ct, stage->getB1()/stage->getA0(), czn1);
			ct = addmul (ct, stage->getB2()/stage->getA0(), czn2);
			cb = addmul (cb, stage->getA1()/stage->getA0(), czn1);
			cb = addmul (cb, stage->getA2()/stage->getA0(), czn2);
			ch   *= ct;
			cbot *= cb;
		}

		return ch / cbot;
	}